

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

char * X86_group_name(csh handle,uint id)

{
  uint id_local;
  csh handle_local;
  
  if ((id < 0xa9) && ((id < 6 || (0x7f < id)))) {
    if (id < 0x80) {
      handle_local = (csh)group_name_maps[id].name;
    }
    else {
      handle_local = (csh)group_name_maps[id - 0x7a].name;
    }
  }
  else {
    handle_local = 0;
  }
  return (char *)handle_local;
}

Assistant:

const char *X86_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	// verify group id
	if (id >= X86_GRP_ENDING || (id > X86_GRP_IRET && id < X86_GRP_VM))
		return NULL;

	// NOTE: when new generic groups are added, 6 must be changed accordingly
	if (id >= 128)
		return group_name_maps[id - 128 + 6].name;
	else
		return group_name_maps[id].name;
#else
	return NULL;
#endif
}